

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor>::FileInfoWrapper
          (FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  IFileReaderFactory *fileReaderFactory_local;
  FileInfoWrapper<ASDCP::ATMOS::MXFReader,_MyAtmosDescriptor> *this_local;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_0011cd40;
  ASDCP::ATMOS::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  MyAtmosDescriptor::MyAtmosDescriptor(&this->m_Desc);
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  ASDCP::UL::UL(&this->m_PictureEssenceCoding);
  return;
}

Assistant:

FileInfoWrapper(const Kumu::IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}